

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

bool __thiscall
Catch::JunitReporter::assertionEnded(JunitReporter *this,AssertionStats *assertionStats)

{
  bool bVar1;
  OfType OVar2;
  long in_RSI;
  AssertionStats *in_RDI;
  CumulativeReporterBase<Catch::JunitReporter> *unaff_retaddr;
  AssertionStats *assertionStats_00;
  
  assertionStats_00 = in_RDI;
  OVar2 = AssertionResult::getResultType((AssertionResult *)(in_RSI + 8));
  if ((OVar2 == ThrewException) &&
     (((ulong)in_RDI[1].assertionResult.m_resultData.lazyExpression.m_transientExpression &
      0x100000000) == 0)) {
    *(int *)&in_RDI[1].assertionResult.m_resultData.lazyExpression.m_transientExpression =
         *(int *)&in_RDI[1].assertionResult.m_resultData.lazyExpression.m_transientExpression + 1;
  }
  bVar1 = CumulativeReporterBase<Catch::JunitReporter>::assertionEnded
                    (unaff_retaddr,assertionStats_00);
  return bVar1;
}

Assistant:

bool JunitReporter::assertionEnded( AssertionStats const& assertionStats ) {
        if( assertionStats.assertionResult.getResultType() == ResultWas::ThrewException && !m_okToFail )
            unexpectedExceptions++;
        return CumulativeReporterBase::assertionEnded( assertionStats );
    }